

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O2

bool __thiscall llvm::DWARFUnit::parseDWO(DWARFUnit *this)

{
  shared_ptr<llvm::DWARFUnit> *this_00;
  uint32_t uVar1;
  element_type *peVar2;
  DWARFSection *pDVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  char **ppcVar7;
  unsigned_long *puVar8;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 aVar9;
  undefined4 extraout_var;
  raw_ostream *prVar10;
  unsigned_long uVar11;
  storage_type *y;
  DWARFListTableBase<llvm::DWARFDebugRnglist> *this_01;
  Error *E;
  StringRef AbsolutePath_00;
  Optional<const_char_*> OVar12;
  Optional<unsigned_long> OVar13;
  undefined1 local_188 [8];
  Expected<llvm::DWARFDebugRnglistTable> TableOrError;
  DWARFDataExtractor RangesDA;
  SmallString<16U> AbsolutePath;
  Optional<const_char_*> DWOFileName;
  Child local_70;
  Optional<unsigned_long> DWOId;
  undefined1 local_58 [8];
  DWARFDie UnitDie;
  Optional<const_char_*> CompilationDir;
  shared_ptr<llvm::DWARFContext> DWOContext;
  
  if (((this->IsDWO != false) ||
      ((this->DWO).super___shared_ptr<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)0x0)) ||
     (_local_58 = getUnitDIE(this,true),
     local_58._8_8_ == (DWARFDebugInfoEntry *)0x0 || local_58 == (DWARFUnit *)0x0)) {
    return false;
  }
  DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_188,(DWARFDie *)local_58,DW_AT_GNU_dwo_name
                );
  OVar12 = dwarf::toString((Optional<llvm::DWARFFormValue> *)local_188);
  AbsolutePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts._8_8_ =
       OVar12.Storage.field_0;
  DWOFileName.Storage.field_0.empty = OVar12.Storage.hasVal;
  if (((undefined1  [16])OVar12.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    return false;
  }
  DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_188,(DWARFDie *)local_58,DW_AT_comp_dir);
  OVar12 = dwarf::toString((Optional<llvm::DWARFFormValue> *)local_188);
  UnitDie.Die = (DWARFDebugInfoEntry *)OVar12.Storage.field_0;
  CompilationDir.Storage.field_0.empty = OVar12.Storage.hasVal;
  RangesDA.Section =
       (DWARFSection *)
       &AbsolutePath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
        super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
        super_SmallVectorBase.Size;
  AbsolutePath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = (void *)0x1000000000;
  ppcVar7 = optional_detail::OptionalStorage<const_char_*,_true>::getValue
                      ((OptionalStorage<const_char_*,_true> *)
                       (AbsolutePath.super_SmallVector<char,_16U>.
                        super_SmallVectorStorage<char,_16U>.InlineElts + 8));
  Twine::Twine((Twine *)local_188,*ppcVar7);
  bVar4 = sys::path::is_relative((Twine *)local_188,native);
  if (((bVar4) && (CompilationDir.Storage.field_0.empty == '\x01')) &&
     (ppcVar7 = optional_detail::OptionalStorage<const_char_*,_true>::getValue
                          ((OptionalStorage<const_char_*,_true> *)&UnitDie.Die),
     *ppcVar7 != (char *)0x0)) {
    ppcVar7 = optional_detail::OptionalStorage<const_char_*,_true>::getValue
                        ((OptionalStorage<const_char_*,_true> *)&UnitDie.Die);
    Twine::Twine((Twine *)local_188,*ppcVar7);
    Twine::Twine((Twine *)&TableOrError.field_0x98,"");
    Twine::Twine((Twine *)&DWOFileName.Storage.hasVal,"");
    Twine::Twine((Twine *)&local_70,"");
    sys::path::append((SmallVectorImpl<char> *)&RangesDA.Section,(Twine *)local_188,
                      (Twine *)&TableOrError.field_0x98,(Twine *)&DWOFileName.Storage.hasVal,
                      (Twine *)&local_70);
  }
  ppcVar7 = optional_detail::OptionalStorage<const_char_*,_true>::getValue
                      ((OptionalStorage<const_char_*,_true> *)
                       (AbsolutePath.super_SmallVector<char,_16U>.
                        super_SmallVectorStorage<char,_16U>.InlineElts + 8));
  Twine::Twine((Twine *)local_188,*ppcVar7);
  Twine::Twine((Twine *)&TableOrError.field_0x98,"");
  Twine::Twine((Twine *)&DWOFileName.Storage.hasVal,"");
  Twine::Twine((Twine *)&local_70,"");
  sys::path::append((SmallVectorImpl<char> *)&RangesDA.Section,(Twine *)local_188,
                    (Twine *)&TableOrError.field_0x98,(Twine *)&DWOFileName.Storage.hasVal,
                    (Twine *)&local_70);
  OVar13 = getDWOId(this);
  local_70 = (Child)OVar13.Storage.field_0;
  DWOId.Storage.field_0.empty = OVar13.Storage.hasVal;
  if (((undefined1  [16])OVar13.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    bVar4 = false;
    goto LAB_00da0409;
  }
  AbsolutePath_00.Length = (size_t)RangesDA.Section;
  AbsolutePath_00.Data = (char *)this->Context;
  DWARFContext::getDWOContext((DWARFContext *)&CompilationDir.Storage.hasVal,AbsolutePath_00);
  if (CompilationDir.Storage._8_8_ == 0) {
LAB_00da0362:
    bVar4 = false;
  }
  else {
    puVar8 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                       ((OptionalStorage<unsigned_long,_true> *)&local_70);
    aVar9 = (anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2)
            DWARFContext::getDWOCompileUnitForHash
                      ((DWARFContext *)CompilationDir.Storage._8_8_,*puVar8);
    if ((DWARFCompileUnit *)aVar9.value == (DWARFCompileUnit *)0x0) goto LAB_00da0362;
    this_00 = &this->DWO;
    local_188 = (undefined1  [8])aVar9;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&TableOrError,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&DWOContext);
    std::__shared_ptr<llvm::DWARFUnit,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<llvm::DWARFUnit,(__gnu_cxx::_Lock_policy)2> *)this_00,
               (__shared_ptr<llvm::DWARFCompileUnit,_(__gnu_cxx::_Lock_policy)2> *)local_188);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&TableOrError);
    peVar2 = (this->DWO).super___shared_ptr<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar1 = this->AddrOffsetSectionBase;
    peVar2->AddrOffsetSection = this->AddrOffsetSection;
    peVar2->AddrOffsetSectionBase = uVar1;
    if ((this->Header).FormParams.Version < 5) {
      OVar13 = DWARFDie::getRangesBaseAttribute((DWARFDie *)local_58);
      local_188 = (undefined1  [8])OVar13.Storage.field_0;
      TableOrError.field_0.TStorage.buffer[0] = OVar13.Storage.hasVal;
      pDVar3 = this->RangeSection;
      peVar2 = (this->DWO).super___shared_ptr<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (((undefined1  [16])OVar13.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        uVar11 = 0;
      }
      else {
        puVar8 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                           ((OptionalStorage<unsigned_long,_true> *)local_188);
        uVar11 = *puVar8;
      }
      peVar2->RangeSection = pDVar3;
      peVar2->RangeSectionBase = uVar11;
    }
    else {
      iVar6 = (*((this->Context->DObj)._M_t.
                 super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                 .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
                _vptr_DWARFObject[0x22])();
      peVar2->RangeSection = (DWARFSection *)CONCAT44(extraout_var,iVar6);
      peVar2->RangeSectionBase = 0;
      RangesDA.Obj = (DWARFObject *)this->RangeSection;
      RangesDA.super_DataExtractor._16_8_ =
           (this->Context->DObj)._M_t.
           super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
           .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
      RangesDA.super_DataExtractor.Data.Length._0_1_ = this->isLittleEndian;
      TableOrError._152_8_ = ((StringRef *)&(RangesDA.Obj)->_vptr_DWARFObject)->Data;
      RangesDA.super_DataExtractor.Data.Data = ((RangesDA.Obj)->Dummy).Data.Data;
      RangesDA.super_DataExtractor.Data.Length._1_1_ = 0;
      parseRngListTableHeader
                ((Expected<llvm::DWARFDebugRnglistTable> *)local_188,
                 (DWARFDataExtractor *)&TableOrError.field_0x98,this->RangeSectionBase,
                 (this->Header).FormParams.Format);
      if ((TableOrError.field_0.TStorage.buffer[0x90] & 1U) == 0) {
        y = Expected<llvm::DWARFDebugRnglistTable>::getStorage
                      ((Expected<llvm::DWARFDebugRnglistTable> *)local_188);
        optional_detail::OptionalStorage<llvm::DWARFDebugRnglistTable,_false>::operator=
                  (&(((this_00->super___shared_ptr<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->RngListTable).Storage,y);
      }
      else {
        prVar10 = WithColor::error();
        prVar10 = raw_ostream::operator<<(prVar10,"parsing a range list table: ");
        Expected<llvm::DWARFDebugRnglistTable>::takeError
                  ((Expected<llvm::DWARFDebugRnglistTable> *)
                   &DWOContext.super___shared_ptr<llvm::DWARFContext,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        toString_abi_cxx11_((string *)&DWOFileName.Storage.hasVal,
                            (llvm *)&DWOContext.
                                     super___shared_ptr<llvm::DWARFContext,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount,E);
        prVar10 = raw_ostream::operator<<(prVar10,(string *)&DWOFileName.Storage.hasVal);
        raw_ostream::operator<<(prVar10,'\n');
        std::__cxx11::string::~string((string *)&DWOFileName.Storage.hasVal);
        if ((long *)((ulong)DWOContext.
                            super___shared_ptr<llvm::DWARFContext,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi & 0xfffffffffffffffe) != (long *)0x0) {
          (**(code **)(*(long *)((ulong)DWOContext.
                                        super___shared_ptr<llvm::DWARFContext,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi & 0xfffffffffffffffe) + 8))();
        }
      }
      Expected<llvm::DWARFDebugRnglistTable>::~Expected
                ((Expected<llvm::DWARFDebugRnglistTable> *)local_188);
      peVar2 = (this_00->super___shared_ptr<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((peVar2->RngListTable).Storage.hasVal == true) {
        this_01 = &optional_detail::OptionalStorage<llvm::DWARFDebugRnglistTable,_false>::getValue
                             (&(peVar2->RngListTable).Storage)->
                   super_DWARFListTableBase<llvm::DWARFDebugRnglist>;
        bVar5 = DWARFListTableBase<llvm::DWARFDebugRnglist>::getHeaderSize(this_01);
        ((this_00->super___shared_ptr<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        RangeSectionBase = (ulong)bVar5;
      }
    }
    bVar4 = true;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&DWOContext);
LAB_00da0409:
  SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&RangesDA.Section);
  return bVar4;
}

Assistant:

bool DWARFUnit::parseDWO() {
  if (IsDWO)
    return false;
  if (DWO.get())
    return false;
  DWARFDie UnitDie = getUnitDIE();
  if (!UnitDie)
    return false;
  auto DWOFileName = dwarf::toString(UnitDie.find(DW_AT_GNU_dwo_name));
  if (!DWOFileName)
    return false;
  auto CompilationDir = dwarf::toString(UnitDie.find(DW_AT_comp_dir));
  SmallString<16> AbsolutePath;
  if (sys::path::is_relative(*DWOFileName) && CompilationDir &&
      *CompilationDir) {
    sys::path::append(AbsolutePath, *CompilationDir);
  }
  sys::path::append(AbsolutePath, *DWOFileName);
  auto DWOId = getDWOId();
  if (!DWOId)
    return false;
  auto DWOContext = Context.getDWOContext(AbsolutePath);
  if (!DWOContext)
    return false;

  DWARFCompileUnit *DWOCU = DWOContext->getDWOCompileUnitForHash(*DWOId);
  if (!DWOCU)
    return false;
  DWO = std::shared_ptr<DWARFCompileUnit>(std::move(DWOContext), DWOCU);
  // Share .debug_addr and .debug_ranges section with compile unit in .dwo
  DWO->setAddrOffsetSection(AddrOffsetSection, AddrOffsetSectionBase);
  if (getVersion() >= 5) {
    DWO->setRangesSection(&Context.getDWARFObj().getRnglistsDWOSection(), 0);
    DWARFDataExtractor RangesDA(Context.getDWARFObj(), *RangeSection,
                                isLittleEndian, 0);
    if (auto TableOrError = parseRngListTableHeader(RangesDA, RangeSectionBase,
                                                    Header.getFormat()))
      DWO->RngListTable = TableOrError.get();
    else
      WithColor::error() << "parsing a range list table: "
                         << toString(TableOrError.takeError())
                         << '\n';
    if (DWO->RngListTable)
      DWO->RangeSectionBase = DWO->RngListTable->getHeaderSize();
  } else {
    auto DWORangesBase = UnitDie.getRangesBaseAttribute();
    DWO->setRangesSection(RangeSection, DWORangesBase ? *DWORangesBase : 0);
  }

  return true;
}